

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall flow::lang::WhileStmt::~WhileStmt(WhileStmt *this)

{
  (this->super_Stmt).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__WhileStmt_00193e30;
  std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::~unique_ptr
            (&this->bodyStmt_);
  std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
            (&this->cond_);
  ASTNode::~ASTNode((ASTNode *)this);
  return;
}

Assistant:

WhileStmt(SourceLocation loc, std::unique_ptr<Expr> cond, std::unique_ptr<Stmt> bodyStmt)
      : Stmt{std::move(loc)},
        cond_{std::move(cond)},
        bodyStmt_{std::move(bodyStmt)} {}